

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void INT_CManager_close(CManager_conflict cm)

{
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  int iVar4;
  pthread_t pVar5;
  long lVar6;
  long in_RDI;
  timespec ts_7;
  timespec ts_6;
  func_entry *shutdown_functions_1;
  int i_1;
  timespec ts_5;
  timespec ts_4;
  int i;
  func_entry *shutdown_functions;
  timespec ts_3;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  CMControlList cl;
  CMControlList in_stack_fffffffffffffec8;
  CManager_conflict in_stack_fffffffffffffed0;
  CManager_conflict in_stack_fffffffffffffed8;
  CMConnection in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  CManager in_stack_fffffffffffffef0;
  CManager_conflict in_stack_ffffffffffffff00;
  long in_stack_ffffffffffffff08;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffff10;
  CMConnection in_stack_ffffffffffffff20;
  timespec local_b0;
  timespec local_a0;
  long local_90;
  uint local_84;
  timespec local_80;
  timespec local_70;
  uint local_5c;
  long local_58;
  timespec local_50;
  timespec local_40;
  timespec local_30;
  timespec local_20;
  long local_10;
  long local_8;
  
  local_10 = *(long *)(in_RDI + 0x20);
  local_8 = in_RDI;
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar2 = CMtrace_init(in_stack_ffffffffffffff10,
                         (CMTraceType)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    if (iVar2 == 0) goto LAB_0011aafb;
  }
  else if (CMtrace_val[7] == 0) goto LAB_0011aafb;
  if (CMtrace_PID != 0) {
    pFVar1 = *(FILE **)(local_8 + 0x120);
    _Var3 = getpid();
    pVar5 = pthread_self();
    fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar5);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_20);
    fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_20.tv_sec,local_20.tv_nsec);
  }
  fprintf(*(FILE **)(local_8 + 0x120),"CManager %p closing, ref count %d\n",local_8,
          (ulong)*(uint *)(local_8 + 0xc));
LAB_0011aafb:
  fflush(*(FILE **)(local_8 + 0x120));
  iVar2 = CMtrace_val[7];
  if (*(long *)(local_8 + 0x120) == 0) {
    iVar2 = CMtrace_init(in_stack_ffffffffffffff10,
                         (CMTraceType)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = *(FILE **)(local_8 + 0x120);
      _Var3 = getpid();
      pVar5 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_30);
      fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_30.tv_sec,local_30.tv_nsec);
    }
    fprintf(*(FILE **)(local_8 + 0x120),
            "CMControlList close CL=%p current reference count will be %d, sdp = %p\n",local_10,
            (ulong)(*(int *)(local_10 + 0xa0) - 1),*(undefined8 *)(local_10 + 0x58));
  }
  fflush(*(FILE **)(local_8 + 0x120));
  INT_CMControlList_close((CMControlList)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  iVar2 = CMtrace_val[7];
  if (*(long *)(local_8 + 0x120) == 0) {
    iVar2 = CMtrace_init(in_stack_ffffffffffffff10,
                         (CMTraceType)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffff20 = *(CMConnection *)(local_8 + 0x120);
      _Var3 = getpid();
      pVar5 = pthread_self();
      fprintf((FILE *)in_stack_ffffffffffffff20,"P%lxT%lx - ",(long)_Var3,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf(*(FILE **)(local_8 + 0x120),"CMControlList CL=%p is closed\n",local_10);
  }
  fflush(*(FILE **)(local_8 + 0x120));
  while (*(int *)(local_8 + 0x68) != 0) {
    iVar2 = CMtrace_val[7];
    if (*(long *)(local_8 + 0x120) == 0) {
      iVar2 = CMtrace_init(in_stack_ffffffffffffff10,
                           (CMTraceType)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_ffffffffffffff10 = *(CManager *)(local_8 + 0x120);
        _Var3 = getpid();
        pVar5 = pthread_self();
        fprintf((FILE *)in_stack_ffffffffffffff10,"P%lxT%lx - ",(long)_Var3,pVar5);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_50);
        fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_50.tv_sec,local_50.tv_nsec);
      }
      fprintf(*(FILE **)(local_8 + 0x120),
              "CManager in close, closing connection %p , ref count %d\n",
              **(undefined8 **)(local_8 + 0x70),(ulong)*(uint *)(**(long **)(local_8 + 0x70) + 0x18)
             );
    }
    fflush(*(FILE **)(local_8 + 0x120));
    internal_connection_close(in_stack_fffffffffffffee0);
    INT_CMConnection_failed(in_stack_ffffffffffffff20);
  }
  if (*(long *)(local_8 + 0x100) != 0) {
    local_58 = *(long *)(local_8 + 0x100);
    local_5c = 0;
    while (*(long *)(local_58 + (long)(int)local_5c * 0x20) != 0) {
      if (*(int *)(local_58 + (long)(int)local_5c * 0x20 + 0x18) == 1) {
        iVar2 = CMtrace_val[7];
        if (*(long *)(local_8 + 0x120) == 0) {
          iVar2 = CMtrace_init(in_stack_ffffffffffffff10,
                               (CMTraceType)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            in_stack_ffffffffffffff00 = *(CManager_conflict *)(local_8 + 0x120);
            _Var3 = getpid();
            in_stack_ffffffffffffff08 = (long)_Var3;
            pVar5 = pthread_self();
            fprintf((FILE *)in_stack_ffffffffffffff00,"P%lxT%lx - ",in_stack_ffffffffffffff08,pVar5)
            ;
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_70);
            fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_70.tv_sec,local_70.tv_nsec);
          }
          fprintf(*(FILE **)(local_8 + 0x120),"CManager calling shutdown function SHUTDOWN %d, %p\n"
                  ,(ulong)local_5c,*(undefined8 *)(local_58 + (long)(int)local_5c * 0x20));
        }
        fflush(*(FILE **)(local_8 + 0x120));
        (**(code **)(local_58 + (long)(int)local_5c * 0x20))
                  (local_8,*(undefined8 *)(local_58 + (long)(int)local_5c * 0x20 + 0x10));
        *(undefined4 *)(local_58 + (long)(int)local_5c * 0x20 + 0x18) = 0;
      }
      local_5c = local_5c + 1;
    }
  }
  *(int *)(local_8 + 0xc) = *(int *)(local_8 + 0xc) + -1;
  iVar2 = CMtrace_val[7];
  if (*(long *)(local_8 + 0x120) == 0) {
    iVar2 = CMtrace_init(in_stack_ffffffffffffff10,
                         (CMTraceType)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_fffffffffffffef0 = *(CManager *)(local_8 + 0x120);
      _Var3 = getpid();
      pVar5 = pthread_self();
      fprintf((FILE *)in_stack_fffffffffffffef0,"P%lxT%lx - ",(long)_Var3,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_80);
      fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_80.tv_sec,local_80.tv_nsec);
    }
    fprintf(*(FILE **)(local_8 + 0x120),"CManager %p ref count now %d\n",local_8,
            (ulong)*(uint *)(local_8 + 0xc));
  }
  fflush(*(FILE **)(local_8 + 0x120));
  iVar2 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  if (*(int *)(local_8 + 0xc) == 0) {
    if (*(long *)(local_8 + 0x100) != 0) {
      local_84 = 0;
      local_90 = *(long *)(local_8 + 0x100);
      *(undefined8 *)(local_8 + 0x100) = 0;
      while (*(long *)(local_90 + (long)(int)local_84 * 0x20) != 0) {
        local_84 = local_84 + 1;
      }
      while( true ) {
        iVar2 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
        local_84 = local_84 - 1;
        if ((int)local_84 < 0) break;
        if (*(int *)(local_90 + (long)(int)local_84 * 0x20 + 0x18) == 2) {
          iVar2 = CMtrace_val[7];
          if (*(long *)(local_8 + 0x120) == 0) {
            iVar2 = CMtrace_init(in_stack_ffffffffffffff10,trace_type);
          }
          if (iVar2 != 0) {
            if (CMtrace_PID != 0) {
              in_stack_fffffffffffffee0 = *(CMConnection *)(local_8 + 0x120);
              _Var3 = getpid();
              in_stack_fffffffffffffee8 = (char *)(long)_Var3;
              pVar5 = pthread_self();
              fprintf((FILE *)in_stack_fffffffffffffee0,"P%lxT%lx - ",in_stack_fffffffffffffee8,
                      pVar5);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_a0);
              fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_a0.tv_sec,local_a0.tv_nsec);
            }
            fprintf(*(FILE **)(local_8 + 0x120),"CManager calling shutdown function FREE %d, %p\n",
                    (ulong)local_84,*(undefined8 *)(local_90 + (long)(int)local_84 * 0x20));
          }
          fflush(*(FILE **)(local_8 + 0x120));
          (**(code **)(local_90 + (long)(int)local_84 * 0x20))
                    (local_8,*(undefined8 *)(local_90 + (long)(int)local_84 * 0x20 + 0x10));
          *(undefined8 *)(local_90 + (long)(int)local_84 * 0x20) = 0;
        }
      }
      INT_CMfree((void *)0x11b4c7);
    }
    iVar4 = CMtrace_val[7];
    if (*(long *)(local_8 + 0x120) == 0) {
      iVar4 = CMtrace_init(in_stack_ffffffffffffff10,trace_type);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_fffffffffffffed0 = *(CManager_conflict *)(local_8 + 0x120);
        _Var3 = getpid();
        lVar6 = (long)_Var3;
        pVar5 = pthread_self();
        fprintf((FILE *)in_stack_fffffffffffffed0,"P%lxT%lx - ",lVar6,pVar5);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_b0);
        fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_b0.tv_sec,local_b0.tv_nsec);
      }
      fprintf(*(FILE **)(local_8 + 0x120),"Freeing CManager %p\n",local_8);
    }
    fflush(*(FILE **)(local_8 + 0x120));
    *(undefined4 *)(local_10 + 0xa4) = 1;
    CMControlList_free(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    IntCManager_unlock(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,iVar2);
    CManager_free(in_stack_ffffffffffffff00);
  }
  else {
    IntCManager_unlock(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,iVar2);
  }
  return;
}

Assistant:

extern void
 INT_CManager_close(CManager cm)
 {
     CMControlList cl = cm->control_list;

     CMtrace_out(cm, CMFreeVerbose, "CManager %p closing, ref count %d\n", cm,
		 cm->reference_count);

     CMtrace_out(cm, CMFreeVerbose, "CMControlList close CL=%p current reference count will be %d, sdp = %p\n", 
		 cl, cl->cl_reference_count - 1, cl->select_data);
     INT_CMControlList_close(cl, cm);
     CMtrace_out(cm, CMFreeVerbose, "CMControlList CL=%p is closed\n", cl);

     while (cm->connection_count != 0) {
	 /* connections are moved down as they are closed... */
	 CMtrace_out(cm, CMFreeVerbose, "CManager in close, closing connection %p , ref count %d\n", cm->connections[0],
		     cm->connections[0]->conn_ref_count);
	 internal_connection_close(cm->connections[0]);
	 INT_CMConnection_failed(cm->connections[0]);
     }

     if (cm->shutdown_functions != NULL) {
	 func_entry *shutdown_functions = cm->shutdown_functions;
	 int i = 0;

	 while (shutdown_functions[i].func != NULL) {
	     if (shutdown_functions[i].task_type == SHUTDOWN_TASK) {
		 CMtrace_out(cm, CMFreeVerbose, "CManager calling shutdown function SHUTDOWN %d, %p\n", i, shutdown_functions[i].func);
		 shutdown_functions[i].func(cm, shutdown_functions[i].client_data);
		 shutdown_functions[i].task_type = NO_TASK;
	     }
	     i++;
	 }
     }
     cm->reference_count--;
     CMtrace_out(cm, CMFreeVerbose, "CManager %p ref count now %d\n", 
		 cm, cm->reference_count);
     if (cm->reference_count == 0) {
	 if (cm->shutdown_functions != NULL) {
	     int i = 0;
	     func_entry *shutdown_functions = cm->shutdown_functions;
	     cm->shutdown_functions = NULL;

	     while (shutdown_functions[i].func != NULL) {
		 i++;
	     }
	     i--;
	     for ( ; i >= 0; i--) {
		 if (shutdown_functions[i].task_type == FREE_TASK) {
		     CMtrace_out(cm, CMFreeVerbose, "CManager calling shutdown function FREE %d, %p\n", i, shutdown_functions[i].func);
		     shutdown_functions[i].func(cm, shutdown_functions[i].client_data);
		     shutdown_functions[i].func = NULL;
		 }
	     }
	     INT_CMfree(shutdown_functions);
	 }
	 CMtrace_out(cm, CMFreeVerbose, "Freeing CManager %p\n", cm);
	 cl->free_reference_count = 1;
	 CMControlList_free(cm, cl);
	 CManager_unlock(cm);
	 CManager_free(cm);
     } else {
	 CManager_unlock(cm);
     }
 }